

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

void Gia_ManFromIfGetConfig
               (Vec_Int_t *vConfigs,If_Man_t *pIfMan,If_Cut_t *pCutBest,int iLit,
               Vec_Str_t *vConfigsStr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  float fVar4;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  word *pwVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  size_t sVar20;
  int iVar21;
  
  uVar7 = pCutBest->iCutFunc;
  if ((int)uVar7 < 0) {
LAB_0021101a:
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                  ,0x1b4,"int If_CutTruthLit(If_Cut_t *)");
  }
  uVar8 = pIfMan->vTtDsds[(byte)pCutBest->field_0x1f]->pArray[uVar7 >> 1];
  if ((int)uVar8 < 0) {
LAB_00211039:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
  pwVar10 = If_DsdManGetFuncConfig(pIfMan->pIfDsdMan,uVar8 ^ uVar7 & 1);
  if (pCutBest->iCutFunc < 0) {
LAB_00210f9e:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  bVar1 = pCutBest->field_0x1f;
  uVar12 = 6;
  if (6 < bVar1) {
    uVar12 = (ulong)(uint)bVar1;
  }
  lVar13 = uVar12 * ((uint)pCutBest->iCutFunc >> 1);
  if (pIfMan->vTtPerms[bVar1]->nSize <= (int)lVar13) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
  }
  pcVar16 = pIfMan->vTtPerms[bVar1]->pArray;
  uVar7 = If_DsdManVarNum(pIfMan->pIfDsdMan);
  uVar8 = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
  iVar9 = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
  uVar19 = iVar9 / (int)uVar7;
  if (vConfigs->nSize < 2) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar3 = vConfigs->pArray[1];
  iVar21 = iVar3;
  if (0 < iVar3) {
    do {
      Vec_IntPush(vConfigs,0);
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
  }
  if (iVar3 < 1) {
LAB_00211096:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  iVar21 = vConfigs->nSize;
  uVar11 = iVar21 - iVar3;
  if ((int)uVar11 < 0) goto LAB_00211096;
  if (iVar9 % (int)uVar7 != 0) {
    __assert_fail("nPermBitNum % nVarNum == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x608,
                  "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
                 );
  }
  piVar5 = vConfigs->pArray;
  if (0 < (int)uVar8) {
    uVar12 = 0;
    do {
      if ((pwVar10[(uVar12 >> 6) + 1] >> (uVar12 & 0x3f) & 1) != 0) {
        *(ulong *)(piVar5 + (ulong)uVar11 + (uVar12 >> 6) * 2) =
             *(ulong *)(piVar5 + (ulong)uVar11 + (uVar12 >> 6) * 2) | 1L << ((byte)uVar12 & 0x3f);
      }
      uVar14 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar14;
    } while (uVar8 != uVar14);
  }
  if (0 < (int)uVar7) {
    uVar12 = 0;
    uVar14 = uVar8;
    do {
      uVar17 = (uint)(*pwVar10 >> ((char)uVar12 * '\x04' & 0x3fU));
      uVar18 = *(uint *)&pCutBest->field_0x1c >> 0x18;
      if (uVar18 <= (uVar17 & 0xf)) {
        __assert_fail("Var < (int)pCutBest->nLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                      ,0x612,
                      "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
                     );
      }
      cVar2 = pcVar16[(ulong)(uVar17 & 0xf) + lVar13];
      if (cVar2 < '\0') goto LAB_00210f9e;
      uVar17 = (uint)(int)cVar2 >> 1;
      if (uVar18 <= uVar17) {
        __assert_fail("Abc_Lit2Var(Lit) < (int)pCutBest->nLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                      ,0x615,
                      "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
                     );
      }
      fVar4 = (&pCutBest[1].Area)[uVar17];
      if (((long)(int)fVar4 < 0) || (pIfMan->vObjs->nSize <= (int)fVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar17 = *(uint *)((long)pIfMan->vObjs->pArray[(int)fVar4] + 0x40);
      if ((int)uVar17 < 0) goto LAB_00210fbd;
      if (0 < (int)uVar19) {
        uVar18 = 0;
        do {
          if (((uVar17 & 1 ^ (int)cVar2) >> (uVar18 & 0x1f) & 1) != 0) {
            *(ulong *)(piVar5 + (ulong)uVar11 + (long)((int)(uVar14 + uVar18) >> 6) * 2) =
                 *(ulong *)(piVar5 + (ulong)uVar11 + (long)((int)(uVar14 + uVar18) >> 6) * 2) |
                 1L << ((byte)(uVar14 + uVar18) & 0x3f);
          }
          uVar18 = uVar18 + 1;
        } while (uVar19 != uVar18);
      }
      uVar12 = uVar12 + 1;
      uVar14 = uVar14 + uVar19;
    } while (uVar12 != uVar7);
  }
  uVar14 = iVar9 + uVar8;
  if (iVar3 * 0x20 <= (int)uVar14) {
    __assert_fail("nTtBitNum + nPermBitNum < 32 * nIntNum",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x61f,
                  "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
                 );
  }
  uVar17 = pCutBest->iCutFunc;
  if ((int)uVar17 < 0) goto LAB_0021101a;
  uVar18 = pIfMan->vTtDsds[*(uint *)&pCutBest->field_0x1c >> 0x18]->pArray[uVar17 >> 1];
  if ((int)uVar18 < 0) goto LAB_00211039;
  if (iLit < 0) {
LAB_00210fbd:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x130,"int Abc_LitIsCompl(int)");
  }
  uVar15 = *(uint *)&pCutBest->field_0x1c >> 0xc;
  pcVar16 = (char *)(ulong)uVar15;
  if (((uVar17 ^ iLit ^ uVar15 ^ uVar18) & 1) != 0) {
    pcVar16 = (char *)(1L << ((byte)uVar14 & 0x3f));
    *(ulong *)(piVar5 + (ulong)uVar11 + (long)((int)uVar14 >> 6) * 2) =
         *(ulong *)(piVar5 + (ulong)uVar11 + (long)((int)uVar14 >> 6) * 2) | (ulong)pcVar16;
  }
  if (iVar21 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
  }
  *piVar5 = *piVar5 + 1;
  if (vConfigsStr == (Vec_Str_t *)0x0) {
    return;
  }
  Vec_StrPrintF(vConfigsStr,pcVar16,(ulong)((uint)iLit >> 1));
  uVar17 = vConfigsStr->nCap;
  if (vConfigsStr->nSize == uVar17) {
    if ((int)uVar17 < 0x10) {
      if (vConfigsStr->pArray == (char *)0x0) {
        pcVar16 = (char *)malloc(0x10);
      }
      else {
        pcVar16 = (char *)realloc(vConfigsStr->pArray,0x10);
      }
      vConfigsStr->pArray = pcVar16;
      sVar20 = 0x10;
    }
    else {
      sVar20 = (ulong)uVar17 * 2;
      if ((int)sVar20 <= (int)uVar17) goto LAB_00210a52;
      if (vConfigsStr->pArray == (char *)0x0) {
        pcVar16 = (char *)malloc(sVar20);
      }
      else {
        pcVar16 = (char *)realloc(vConfigsStr->pArray,sVar20);
      }
      vConfigsStr->pArray = pcVar16;
    }
    vConfigsStr->nCap = (int)sVar20;
  }
LAB_00210a52:
  iVar9 = vConfigsStr->nSize;
  vConfigsStr->nSize = iVar9 + 1;
  vConfigsStr->pArray[iVar9] = ' ';
  if (0 < (int)uVar8) {
    uVar12 = 0;
    do {
      uVar6 = *(ulong *)(piVar5 + (ulong)uVar11 + (uVar12 >> 6) * 2);
      uVar17 = vConfigsStr->nCap;
      if (vConfigsStr->nSize == uVar17) {
        if ((int)uVar17 < 0x10) {
          if (vConfigsStr->pArray == (char *)0x0) {
            pcVar16 = (char *)malloc(0x10);
          }
          else {
            pcVar16 = (char *)realloc(vConfigsStr->pArray,0x10);
          }
          sVar20 = 0x10;
        }
        else {
          sVar20 = (ulong)uVar17 * 2;
          if ((int)sVar20 <= (int)uVar17) goto LAB_00210add;
          if (vConfigsStr->pArray == (char *)0x0) {
            pcVar16 = (char *)malloc(sVar20);
          }
          else {
            pcVar16 = (char *)realloc(vConfigsStr->pArray,sVar20);
          }
        }
        vConfigsStr->pArray = pcVar16;
        vConfigsStr->nCap = (int)sVar20;
      }
LAB_00210add:
      iVar9 = vConfigsStr->nSize;
      vConfigsStr->nSize = iVar9 + 1;
      vConfigsStr->pArray[iVar9] = (uVar6 >> (uVar12 & 0x3f) & 1) == 0 ^ 0x31;
      uVar17 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar17;
    } while (uVar8 != uVar17);
  }
  uVar17 = vConfigsStr->nCap;
  if (vConfigsStr->nSize == uVar17) {
    if ((int)uVar17 < 0x10) {
      if (vConfigsStr->pArray == (char *)0x0) {
        pcVar16 = (char *)malloc(0x10);
      }
      else {
        pcVar16 = (char *)realloc(vConfigsStr->pArray,0x10);
      }
      sVar20 = 0x10;
    }
    else {
      sVar20 = (ulong)uVar17 * 2;
      if ((int)sVar20 <= (int)uVar17) goto LAB_00210b6a;
      if (vConfigsStr->pArray == (char *)0x0) {
        pcVar16 = (char *)malloc(sVar20);
      }
      else {
        pcVar16 = (char *)realloc(vConfigsStr->pArray,sVar20);
      }
    }
    vConfigsStr->pArray = pcVar16;
    vConfigsStr->nCap = (int)sVar20;
  }
LAB_00210b6a:
  iVar9 = vConfigsStr->nSize;
  vConfigsStr->nSize = iVar9 + 1;
  vConfigsStr->pArray[iVar9] = ' ';
  uVar17 = vConfigsStr->nCap;
  if (vConfigsStr->nSize == uVar17) {
    if ((int)uVar17 < 0x10) {
      if (vConfigsStr->pArray == (char *)0x0) {
        pcVar16 = (char *)malloc(0x10);
      }
      else {
        pcVar16 = (char *)realloc(vConfigsStr->pArray,0x10);
      }
      sVar20 = 0x10;
    }
    else {
      sVar20 = (ulong)uVar17 * 2;
      if ((int)sVar20 <= (int)uVar17) goto LAB_00210bdd;
      if (vConfigsStr->pArray == (char *)0x0) {
        pcVar16 = (char *)malloc(sVar20);
      }
      else {
        pcVar16 = (char *)realloc(vConfigsStr->pArray,sVar20);
      }
    }
    vConfigsStr->pArray = pcVar16;
    vConfigsStr->nCap = (int)sVar20;
  }
LAB_00210bdd:
  iVar9 = vConfigsStr->nSize;
  vConfigsStr->nSize = iVar9 + 1;
  vConfigsStr->pArray[iVar9] = ' ';
  if (0 < (int)uVar7) {
    uVar17 = 0;
    do {
      if (0 < (int)uVar19) {
        uVar18 = 0;
        do {
          uVar12 = *(ulong *)(piVar5 + (ulong)uVar11 + (long)((int)(uVar8 + uVar18) >> 6) * 2);
          uVar15 = vConfigsStr->nCap;
          if (vConfigsStr->nSize == uVar15) {
            if ((int)uVar15 < 0x10) {
              if (vConfigsStr->pArray == (char *)0x0) {
                pcVar16 = (char *)malloc(0x10);
              }
              else {
                pcVar16 = (char *)realloc(vConfigsStr->pArray,0x10);
              }
              sVar20 = 0x10;
            }
            else {
              sVar20 = (ulong)uVar15 * 2;
              if ((int)sVar20 <= (int)uVar15) goto LAB_00210c88;
              if (vConfigsStr->pArray == (char *)0x0) {
                pcVar16 = (char *)malloc(sVar20);
              }
              else {
                pcVar16 = (char *)realloc(vConfigsStr->pArray,sVar20);
              }
            }
            vConfigsStr->pArray = pcVar16;
            vConfigsStr->nCap = (int)sVar20;
          }
LAB_00210c88:
          iVar9 = vConfigsStr->nSize;
          vConfigsStr->nSize = iVar9 + 1;
          vConfigsStr->pArray[iVar9] = (uVar12 >> ((ulong)(uVar8 + uVar18) & 0x3f) & 1) == 0 ^ 0x31;
          if (uVar18 == 0) {
            uVar15 = vConfigsStr->nCap;
            if (vConfigsStr->nSize == uVar15) {
              if ((int)uVar15 < 0x10) {
                if (vConfigsStr->pArray == (char *)0x0) {
                  pcVar16 = (char *)malloc(0x10);
                }
                else {
                  pcVar16 = (char *)realloc(vConfigsStr->pArray,0x10);
                }
                sVar20 = 0x10;
              }
              else {
                sVar20 = (ulong)uVar15 * 2;
                if ((int)sVar20 <= (int)uVar15) goto LAB_00210d09;
                if (vConfigsStr->pArray == (char *)0x0) {
                  pcVar16 = (char *)malloc(sVar20);
                }
                else {
                  pcVar16 = (char *)realloc(vConfigsStr->pArray,sVar20);
                }
              }
              vConfigsStr->pArray = pcVar16;
              vConfigsStr->nCap = (int)sVar20;
            }
LAB_00210d09:
            iVar9 = vConfigsStr->nSize;
            vConfigsStr->nSize = iVar9 + 1;
            vConfigsStr->pArray[iVar9] = ' ';
          }
          uVar18 = uVar18 + 1;
        } while (uVar19 != uVar18);
      }
      uVar18 = vConfigsStr->nCap;
      if (vConfigsStr->nSize == uVar18) {
        if ((int)uVar18 < 0x10) {
          if (vConfigsStr->pArray == (char *)0x0) {
            pcVar16 = (char *)malloc(0x10);
          }
          else {
            pcVar16 = (char *)realloc(vConfigsStr->pArray,0x10);
          }
          sVar20 = 0x10;
        }
        else {
          sVar20 = (ulong)uVar18 * 2;
          if ((int)sVar20 <= (int)uVar18) goto LAB_00210d93;
          if (vConfigsStr->pArray == (char *)0x0) {
            pcVar16 = (char *)malloc(sVar20);
          }
          else {
            pcVar16 = (char *)realloc(vConfigsStr->pArray,sVar20);
          }
        }
        vConfigsStr->pArray = pcVar16;
        vConfigsStr->nCap = (int)sVar20;
      }
LAB_00210d93:
      iVar9 = vConfigsStr->nSize;
      vConfigsStr->nSize = iVar9 + 1;
      vConfigsStr->pArray[iVar9] = ' ';
      uVar18 = vConfigsStr->nCap;
      if (vConfigsStr->nSize == uVar18) {
        if ((int)uVar18 < 0x10) {
          if (vConfigsStr->pArray == (char *)0x0) {
            pcVar16 = (char *)malloc(0x10);
          }
          else {
            pcVar16 = (char *)realloc(vConfigsStr->pArray,0x10);
          }
          sVar20 = 0x10;
        }
        else {
          sVar20 = (ulong)uVar18 * 2;
          if ((int)sVar20 <= (int)uVar18) goto LAB_00210e0e;
          if (vConfigsStr->pArray == (char *)0x0) {
            pcVar16 = (char *)malloc(sVar20);
          }
          else {
            pcVar16 = (char *)realloc(vConfigsStr->pArray,sVar20);
          }
        }
        vConfigsStr->pArray = pcVar16;
        vConfigsStr->nCap = (int)sVar20;
      }
LAB_00210e0e:
      iVar9 = vConfigsStr->nSize;
      vConfigsStr->nSize = iVar9 + 1;
      vConfigsStr->pArray[iVar9] = ' ';
      uVar17 = uVar17 + 1;
      uVar8 = uVar8 + uVar19;
    } while (uVar17 != uVar7);
  }
  uVar12 = *(ulong *)(piVar5 + (ulong)uVar11 + (long)((int)uVar14 >> 6) * 2);
  uVar7 = vConfigsStr->nCap;
  if (vConfigsStr->nSize == uVar7) {
    if ((int)uVar7 < 0x10) {
      if (vConfigsStr->pArray == (char *)0x0) {
        pcVar16 = (char *)malloc(0x10);
      }
      else {
        pcVar16 = (char *)realloc(vConfigsStr->pArray,0x10);
      }
      sVar20 = 0x10;
    }
    else {
      sVar20 = (ulong)uVar7 * 2;
      if ((int)sVar20 <= (int)uVar7) goto LAB_00210ec2;
      if (vConfigsStr->pArray == (char *)0x0) {
        pcVar16 = (char *)malloc(sVar20);
      }
      else {
        pcVar16 = (char *)realloc(vConfigsStr->pArray,sVar20);
      }
    }
    vConfigsStr->pArray = pcVar16;
    vConfigsStr->nCap = (int)sVar20;
  }
LAB_00210ec2:
  iVar9 = vConfigsStr->nSize;
  vConfigsStr->nSize = iVar9 + 1;
  vConfigsStr->pArray[iVar9] = (uVar12 >> ((ulong)uVar14 & 0x3f) & 1) == 0 ^ 0x31;
  uVar7 = vConfigsStr->nCap;
  if (vConfigsStr->nSize == uVar7) {
    if ((int)uVar7 < 0x10) {
      if (vConfigsStr->pArray == (char *)0x0) {
        pcVar16 = (char *)malloc(0x10);
      }
      else {
        pcVar16 = (char *)realloc(vConfigsStr->pArray,0x10);
      }
      sVar20 = 0x10;
    }
    else {
      sVar20 = (ulong)uVar7 * 2;
      if ((int)sVar20 <= (int)uVar7) goto LAB_00210f2d;
      if (vConfigsStr->pArray == (char *)0x0) {
        pcVar16 = (char *)malloc(sVar20);
      }
      else {
        pcVar16 = (char *)realloc(vConfigsStr->pArray,sVar20);
      }
    }
    vConfigsStr->pArray = pcVar16;
    vConfigsStr->nCap = (int)sVar20;
  }
LAB_00210f2d:
  iVar9 = vConfigsStr->nSize;
  vConfigsStr->nSize = iVar9 + 1;
  vConfigsStr->pArray[iVar9] = '\n';
  return;
}

Assistant:

void Gia_ManFromIfGetConfig( Vec_Int_t * vConfigs, If_Man_t * pIfMan, If_Cut_t * pCutBest, int iLit, Vec_Str_t * vConfigsStr )
{
    If_Obj_t * pIfObj = NULL;
    word * pPerm = If_DsdManGetFuncConfig( pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest) ); // cell input -> DSD input
    char * pCutPerm = If_CutDsdPerm( pIfMan, pCutBest ); // DSD input -> cut input
    word * pArray;  int v, i, Lit, Var;
    int nVarNum = If_DsdManVarNum(pIfMan->pIfDsdMan);
    int nTtBitNum = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
    int nPermBitNum = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
    int nPermBitOne = nPermBitNum / nVarNum;
    // prepare storage
    int nIntNum = Vec_IntEntry( vConfigs, 1 );
    for ( i = 0; i < nIntNum; i++ )
        Vec_IntPush( vConfigs, 0 );
    pArray = (word *)Vec_IntEntryP( vConfigs, Vec_IntSize(vConfigs) - nIntNum );
    assert( nPermBitNum % nVarNum == 0 );
    // set truth table bits
    for ( i = 0; i < nTtBitNum; i++ )
        if ( Abc_TtGetBit(pPerm + 1, i) )
            Abc_TtSetBit( pArray, i );
    // set permutation bits
    for ( v = 0; v < nVarNum; v++ )
    {
        // get DSD variable
        Var = ((pPerm[0] >> (v * 4)) & 0xF);
        assert( Var < (int)pCutBest->nLeaves );
        // get AIG literal
        Lit = (int)pCutPerm[Var];
        assert( Abc_Lit2Var(Lit) < (int)pCutBest->nLeaves );
        // complement if polarity has changed
        pIfObj = If_ManObj( pIfMan, pCutBest->pLeaves[Abc_Lit2Var(Lit)] );
        Lit = Abc_LitNotCond( Lit, Abc_LitIsCompl(pIfObj->iCopy) );
        // create config literal
        for ( i = 0; i < nPermBitOne; i++ )
            if ( (Lit >> i) & 1 )
                Abc_TtSetBit( pArray, nTtBitNum + v * nPermBitOne + i );
    }
    // remember complementation
    assert( nTtBitNum + nPermBitNum < 32 * nIntNum );
    if ( Abc_LitIsCompl(If_CutDsdLit(pIfMan, pCutBest)) ^ pCutBest->fCompl ^ Abc_LitIsCompl(iLit) )
        Abc_TtSetBit( pArray, nTtBitNum + nPermBitNum );
    // update count
    Vec_IntAddToEntry( vConfigs, 0, 1 );
    // write configs
    if ( vConfigsStr )
    {
        Vec_StrPrintF( vConfigsStr, "%d", Abc_Lit2Var(iLit) );
        Vec_StrPush( vConfigsStr, ' ' );
        for ( i = 0; i < nTtBitNum; i++ )
            Vec_StrPush( vConfigsStr, (char)(Abc_TtGetBit(pArray, i) ? '1' : '0') );
        Vec_StrPush( vConfigsStr, ' ' );
        Vec_StrPush( vConfigsStr, ' ' );
        for ( v = 0; v < nVarNum; v++ )
        {
            for ( i = 0; i < nPermBitOne; i++ )
            {
                Vec_StrPush( vConfigsStr, (char)(Abc_TtGetBit(pArray, nTtBitNum + v * nPermBitOne + i) ? '1' : '0') );
                if ( i == 0 ) 
                    Vec_StrPush( vConfigsStr, ' ' );
            }
            Vec_StrPush( vConfigsStr, ' ' );
            Vec_StrPush( vConfigsStr, ' ' );
        }
        Vec_StrPush( vConfigsStr, (char)(Abc_TtGetBit(pArray, nTtBitNum + nPermBitNum) ? '1' : '0') );
        Vec_StrPush( vConfigsStr, '\n' );
    }
}